

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_attn_temp::set_input(llm_graph_input_attn_temp *this,llama_ubatch *ubatch)

{
  undefined8 uVar1;
  reference pvVar2;
  float *pfVar3;
  vector<float,_std::allocator<float>_> *this_00;
  long lVar4;
  long in_RSI;
  long in_RDI;
  float fVar5;
  double dVar6;
  float pos;
  int i;
  vector<float,_std::allocator<float>_> attn_scale_data;
  int64_t n_tokens;
  allocator_type *in_stack_ffffffffffffff78;
  value_type_conflict5 *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_48;
  vector<float,_std::allocator<float>_> local_30;
  ulong local_18;
  long local_10;
  
  if ((*(long *)(in_RSI + 0x20) != 0) && (*(long *)(in_RDI + 8) != 0)) {
    local_18 = (ulong)*(uint *)(in_RSI + 4);
    local_10 = in_RSI;
    std::allocator<float>::allocator((allocator<float> *)0x43030e);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::allocator<float>::~allocator((allocator<float> *)0x430333);
    for (local_48 = 0; (long)local_48 < (long)local_18; local_48 = local_48 + 1) {
      dVar6 = std::floor((double)(ulong)(uint)(((float)*(int *)(*(long *)(local_10 + 0x20) +
                                                               (long)local_48 * 4) + 1.0) /
                                              (float)*(uint *)(in_RDI + 0x18)));
      dVar6 = log((double)SUB84(dVar6,0) + 1.0);
      fVar5 = (float)(dVar6 * (double)*(float *)(in_RDI + 0x1c) + 1.0);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_48);
      *pvVar2 = fVar5;
    }
    uVar1 = *(undefined8 *)(in_RDI + 8);
    pfVar3 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x430455);
    this_00 = (vector<float,_std::allocator<float>_> *)(local_18 * *(long *)(in_RDI + 0x10));
    lVar4 = ggml_element_size(*(undefined8 *)(in_RDI + 8));
    ggml_backend_tensor_set(uVar1,pfVar3,0,(long)this_00 * lVar4);
    std::vector<float,_std::allocator<float>_>::~vector(this_00);
  }
  return;
}

Assistant:

void llm_graph_input_attn_temp::set_input(const llama_ubatch * ubatch) {
    if (ubatch->pos && attn_scale) {
        const int64_t n_tokens = ubatch->n_tokens;

        std::vector<float> attn_scale_data(n_tokens, 0.0f);
        for (int i = 0; i < n_tokens; ++i) {
            const float pos = ubatch->pos[i];
            attn_scale_data[i] = std::log(
                std::floor((pos + 1.0f) / n_attn_temp_floor_scale) + 1.0
            ) * f_attn_temp_scale + 1.0;
        }

        ggml_backend_tensor_set(attn_scale, attn_scale_data.data(), 0, n_tokens*n_pos_per_token*ggml_element_size(attn_scale));
    }
}